

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

float __thiscall
double_conversion::Strtof(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  undefined1 auVar1 [12];
  bool bVar2;
  int iVar3;
  double_conversion **guess;
  float fVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp DVar9;
  int updated_exponent;
  double double_guess;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  Double local_368;
  double local_360;
  undefined1 local_354 [12];
  double_conversion *local_348;
  uint local_340;
  char local_338 [784];
  
  buffer_00._8_8_ = buffer.start_;
  guess = &local_348;
  local_348 = (double_conversion *)0x0;
  local_340 = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess,(Vector<const_char> *)local_354,
             (int *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  buffer_01.length_ = local_340;
  buffer_01.start_ = (char *)local_348;
  trimmed_00.start_ = (ulong)local_340;
  trimmed_00.length_ = local_354._0_4_;
  trimmed_00._12_4_ = 0;
  bVar2 = ComputeGuess(local_348,trimmed_00,(int)local_354 + 4,(double *)guess);
  if (3.4028234663852886e+38 <= (double)local_354._4_8_) {
    if (3.4028235677973366e+38 <= (double)local_354._4_8_) {
      fVar4 = INFINITY;
    }
    else {
      fVar4 = 3.4028235e+38;
    }
  }
  else {
    fVar4 = (float)(double)local_354._4_8_;
  }
  if (((double)local_354._4_8_ != (double)fVar4) ||
     (NAN((double)local_354._4_8_) || NAN((double)fVar4))) {
    local_368.d64_ = local_354._4_8_;
    local_360 = (double)local_354._4_8_;
    dVar5 = Double::NextDouble(&local_368);
    local_368.d64_ = (uint64_t)local_360;
    dVar6 = Double::PreviousDouble(&local_368);
    if (3.4028234663852886e+38 <= dVar6) {
      if (3.4028235677973366e+38 <= dVar6) {
        fVar7 = INFINITY;
      }
      else {
        fVar7 = 3.4028235e+38;
      }
    }
    else {
      fVar7 = (float)dVar6;
    }
    if (3.4028234663852886e+38 <= dVar5) {
      if (3.4028235677973366e+38 <= dVar5) {
        fVar8 = INFINITY;
      }
      else {
        fVar8 = 3.4028235e+38;
      }
    }
    else {
      fVar8 = (float)dVar5;
    }
    if (!bVar2) {
      local_368.d64_ = (uint64_t)dVar5;
      dVar5 = Double::NextDouble(&local_368);
      if (3.4028234663852886e+38 <= dVar5) {
        if (3.4028235677973366e+38 <= dVar5) {
          fVar8 = INFINITY;
        }
        else {
          fVar8 = 3.4028235e+38;
        }
      }
      else {
        fVar8 = (float)dVar5;
      }
    }
    if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        local_368.d64_._0_4_ = fVar7;
        DVar9 = Single::UpperBoundary((Single *)&local_368);
        auVar1 = DVar9._0_12_;
      }
      else {
        local_368.d64_ = 0x3690000000000000;
        DVar9 = Double::AsDiyFp(&local_368);
        auVar1 = DVar9._0_12_;
      }
      DVar9._12_4_ = 0;
      DVar9.f_ = auVar1._0_8_;
      DVar9.e_ = auVar1._8_4_;
      buffer_01._12_4_ = 0;
      iVar3 = CompareBufferWithDiyFp(buffer_01,local_354._0_4_,DVar9);
      fVar4 = fVar7;
      if (((-1 < iVar3) && (fVar4 = fVar8, iVar3 == 0)) && (fVar4 = fVar7, ((uint)fVar7 & 1) != 0))
      {
        fVar4 = fVar8;
      }
    }
  }
  return fVar4;
}

Assistant:

float Strtof(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double double_guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &double_guess);

  float float_guess = SanitizedDoubletof(double_guess);
  if (float_guess == double_guess) {
    // This shortcut triggers for integer values.
    return float_guess;
  }

  // We must catch double-rounding. Say the double has been rounded up, and is
  // now a boundary of a float, and rounds up again. This is why we have to
  // look at previous too.
  // Example (in decimal numbers):
  //    input: 12349
  //    high-precision (4 digits): 1235
  //    low-precision (3 digits):
  //       when read from input: 123
  //       when rounded from high precision: 124.
  // To do this we simply look at the neigbors of the correct result and see
  // if they would round to the same float. If the guess is not correct we have
  // to look at four values (since two different doubles could be the correct
  // double).

  double double_next = Double(double_guess).NextDouble();
  double double_previous = Double(double_guess).PreviousDouble();

  float f1 = SanitizedDoubletof(double_previous);
  float f2 = float_guess;
  float f3 = SanitizedDoubletof(double_next);
  float f4;
  if (is_correct) {
    f4 = f3;
  } else {
    double double_next2 = Double(double_next).NextDouble();
    f4 = SanitizedDoubletof(double_next2);
  }
  (void) f2;  // Mark variable as used.
  DOUBLE_CONVERSION_ASSERT(f1 <= f2 && f2 <= f3 && f3 <= f4);

  // If the guess doesn't lie near a single-precision boundary we can simply
  // return its float-value.
  if (f1 == f4) {
    return float_guess;
  }

  DOUBLE_CONVERSION_ASSERT((f1 != f2 && f2 == f3 && f3 == f4) ||
         (f1 == f2 && f2 != f3 && f3 == f4) ||
         (f1 == f2 && f2 == f3 && f3 != f4));

  // guess and next are the two possible candidates (in the same way that
  // double_guess was the lower candidate for a double-precision guess).
  float guess = f1;
  float next = f4;
  DiyFp upper_boundary;
  if (guess == 0.0f) {
    float min_float = 1e-45f;
    upper_boundary = Double(static_cast<double>(min_float) / 2).AsDiyFp();
  } else {
    upper_boundary = Single(guess).UpperBoundary();
  }
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return next;
  } else if ((Single(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return next;
  }
}